

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvPostProcess.cpp
# Opt level: O1

void __thiscall spv::Builder::postProcess(Builder *this,Instruction *inst)

{
  _Rb_tree_header *p_Var1;
  Op OVar2;
  Instruction *pIVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  int iVar8;
  Id IVar9;
  int iVar10;
  uint uVar11;
  _Rb_tree_node_base *p_Var12;
  pointer ppIVar13;
  uint idx;
  ulong uVar14;
  Instruction *pIVar15;
  uint local_48;
  Capability local_44;
  Instruction *local_40;
  Instruction *local_38;
  
  OVar2 = inst->opCode;
  if ((int)OVar2 < 0xd2) {
    if (OVar2 - OpImageQuerySizeLod < 5) {
      local_44 = CapabilityImageQuery;
    }
    else {
      if (OVar2 - OpLoad < 2) {
        if ((*(inst->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 1) == 0) {
LAB_0046da3f:
          __assert_fail("idOperand[op]",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                        ,0xa1,"Id spv::Instruction::getIdOperand(int) const");
        }
        ppIVar13 = (this->module).idToInstruction.
                   super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pIVar15 = ppIVar13[*(inst->operands).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start];
        if (pIVar15->opCode == OpAccessChain) {
          if ((*(pIVar15->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 1) == 0)
          goto LAB_0046da3f;
          pIVar3 = ppIVar13[ppIVar13[*(pIVar15->operands).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start]->typeId];
          if (pIVar3->opCode != OpTypePointer) {
            __assert_fail("type->getOpCode() == OpTypePointer",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvPostProcess.cpp"
                          ,0xff,"void spv::Builder::postProcess(Instruction &)");
          }
          uVar14 = **(ulong **)
                     &(pIVar3->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data;
          if ((uVar14 & 1) != 0) goto LAB_0046da5e;
          piVar4 = *(int **)&(pIVar3->operands).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data;
          if (*piVar4 == 0x14e5) {
            if ((uVar14 & 2) == 0) goto LAB_0046da3f;
            uVar14 = (ulong)(uint)piVar4[1];
            local_40 = ppIVar13[uVar14];
            iVar8 = Instruction::getNumOperands(pIVar15);
            local_48 = 0;
            if (1 < iVar8) {
              p_Var1 = &(this->decorations)._M_t._M_impl.super__Rb_tree_header;
              iVar8 = 1;
              local_48 = 0;
              local_38 = pIVar15;
              do {
                IVar9 = Instruction::getIdOperand(pIVar15,iVar8);
                ppIVar13 = (this->module).idToInstruction.
                           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                if (local_40->opCode - OpTypeArray < 2) {
                  for (p_Var12 = (this->decorations)._M_t._M_impl.super__Rb_tree_header._M_header.
                                 _M_left; (_Rb_tree_header *)p_Var12 != p_Var1;
                      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
                    lVar5 = *(long *)(p_Var12 + 1);
                    if (*(int *)(lVar5 + 0x10) == 0x47) {
                      uVar6 = **(ulong **)(lVar5 + 0x30);
                      if ((uVar6 & 1) == 0) goto LAB_0046da3f;
                      piVar4 = *(int **)(lVar5 + 0x18);
                      if (*piVar4 == (int)uVar14) {
                        if ((uVar6 & 2) != 0) goto LAB_0046da5e;
                        if (piVar4[1] == 6) {
                          if ((uVar6 & 4) != 0) goto LAB_0046da5e;
                          local_48 = local_48 | piVar4[2];
                        }
                      }
                    }
                  }
                  if ((*(local_40->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 1) == 0)
                  goto LAB_0046da3f;
                  uVar14 = (ulong)*(local_40->operands).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start;
                  ppIVar13 = ppIVar13 + uVar14;
LAB_0046d95d:
                  local_40 = *ppIVar13;
                  bVar7 = true;
                }
                else {
                  if (local_40->opCode == OpTypeStruct) {
                    pIVar15 = ppIVar13[IVar9];
                    if (pIVar15->opCode != OpConstant) {
                      __assert_fail("idx->getOpCode() == OpConstant",
                                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvPostProcess.cpp"
                                    ,0x10e,"void spv::Builder::postProcess(Instruction &)");
                    }
                    if ((**(byte **)&(pIVar15->idOperand).super__Bvector_base<std::allocator<bool>_>
                                     ._M_impl.super__Bvector_impl_data & 1) == 0) {
                      iVar10 = **(int **)&(pIVar15->operands).
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data;
                      for (p_Var12 = (this->decorations)._M_t._M_impl.super__Rb_tree_header.
                                     _M_header._M_left; (_Rb_tree_header *)p_Var12 != p_Var1;
                          p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
                        lVar5 = *(long *)(p_Var12 + 1);
                        if (*(int *)(lVar5 + 0x10) == 0x48) {
                          uVar6 = **(ulong **)(lVar5 + 0x30);
                          if ((uVar6 & 1) == 0) goto LAB_0046da3f;
                          piVar4 = *(int **)(lVar5 + 0x18);
                          if (*piVar4 == (int)uVar14) {
                            if ((uVar6 & 2) != 0) goto LAB_0046da5e;
                            if (piVar4[1] == iVar10) {
                              if ((uVar6 & 4) != 0) goto LAB_0046da5e;
                              if ((piVar4[2] == 0x23) || (piVar4[2] == 7)) {
                                if ((uVar6 & 8) != 0) goto LAB_0046da5e;
                                local_48 = local_48 | piVar4[3];
                              }
                            }
                          }
                        }
                      }
                      IVar9 = Instruction::getIdOperand(local_40,iVar10);
                      uVar14 = (ulong)IVar9;
                      ppIVar13 = (this->module).idToInstruction.
                                 super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start + IVar9;
                      goto LAB_0046d95d;
                    }
                    goto LAB_0046da5e;
                  }
                  bVar7 = false;
                }
                pIVar15 = local_38;
                if (!bVar7) break;
                iVar8 = iVar8 + 1;
                iVar10 = Instruction::getNumOperands(local_38);
              } while (iVar8 < iVar10);
            }
            iVar8 = Instruction::getNumOperands(inst);
            if (iVar8 < 3) {
              __assert_fail("inst.getNumOperands() >= 3",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvPostProcess.cpp"
                            ,0x130,"void spv::Builder::postProcess(Instruction &)");
            }
            uVar11 = Instruction::getImmediateOperand(inst,(inst->opCode == OpStore) + 1);
            if ((uVar11 & 2) == 0) {
              __assert_fail("memoryAccess & MemoryAccessAlignedMask",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvPostProcess.cpp"
                            ,0x132,"void spv::Builder::postProcess(Instruction &)");
            }
            idx = inst->opCode == OpStore | 2;
            uVar11 = Instruction::getImmediateOperand(inst,idx);
            Instruction::setImmediateOperand(inst,idx,-(local_48 | uVar11) & (local_48 | uVar11));
          }
        }
        goto LAB_0046d691;
      }
      if (OVar2 != OpExtInst) goto LAB_0046d691;
      if ((*(inst->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 2) != 0) {
LAB_0046da5e:
        __assert_fail("!idOperand[op]",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                      ,0xa5,"unsigned int spv::Instruction::getImmediateOperand(int) const");
      }
      if (2 < (inst->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[1] - 0x4c) goto LAB_0046d691;
      local_44 = CapabilityInterpolationFunction;
    }
  }
  else if (OVar2 - OpDPdxFine < 6) {
    local_44 = CapabilityDerivativeControl;
  }
  else {
    if (OVar2 != OpGroupNonUniformPartitionNV) goto LAB_0046d691;
    addExtension(this,"SPV_NV_shader_subgroup_partitioned");
    local_44 = CapabilityGroupNonUniformPartitionedNV;
  }
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
              *)&this->capabilities,&local_44);
LAB_0046d691:
  if (inst->typeId != 0) {
    postProcessType(this,inst,inst->typeId);
  }
  iVar8 = Instruction::getNumOperands(inst);
  if (0 < iVar8) {
    uVar14 = 0;
    do {
      if (((inst->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar14 >> 6] >>
           (uVar14 & 0x3f) & 1) != 0) {
        IVar9 = Instruction::getIdOperand(inst,(int)uVar14);
        pIVar15 = (this->module).idToInstruction.
                  super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[IVar9];
        if ((pIVar15 != (Instruction *)0x0) && (pIVar15->typeId != 0)) {
          IVar9 = Instruction::getIdOperand(inst,(int)uVar14);
          pIVar15 = (this->module).idToInstruction.
                    super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[IVar9];
          if (pIVar15 == (Instruction *)0x0) {
            IVar9 = 0;
          }
          else {
            IVar9 = pIVar15->typeId;
          }
          postProcessType(this,inst,IVar9);
        }
      }
      uVar14 = uVar14 + 1;
      iVar8 = Instruction::getNumOperands(inst);
    } while ((long)uVar14 < (long)iVar8);
  }
  return;
}

Assistant:

void Builder::postProcess(Instruction& inst)
{
    // Add capabilities based simply on the opcode.
    switch (inst.getOpCode()) {
    case OpExtInst:
        switch (inst.getImmediateOperand(1)) {
        case GLSLstd450InterpolateAtCentroid:
        case GLSLstd450InterpolateAtSample:
        case GLSLstd450InterpolateAtOffset:
            addCapability(CapabilityInterpolationFunction);
            break;
        default:
            break;
        }
        break;
    case OpDPdxFine:
    case OpDPdyFine:
    case OpFwidthFine:
    case OpDPdxCoarse:
    case OpDPdyCoarse:
    case OpFwidthCoarse:
        addCapability(CapabilityDerivativeControl);
        break;

    case OpImageQueryLod:
    case OpImageQuerySize:
    case OpImageQuerySizeLod:
    case OpImageQuerySamples:
    case OpImageQueryLevels:
        addCapability(CapabilityImageQuery);
        break;

    case OpGroupNonUniformPartitionNV:
        addExtension(E_SPV_NV_shader_subgroup_partitioned);
        addCapability(CapabilityGroupNonUniformPartitionedNV);
        break;

    case OpLoad:
    case OpStore:
        {
            // For any load/store to a PhysicalStorageBufferEXT, walk the accesschain
            // index list to compute the misalignment. The pre-existing alignment value
            // (set via Builder::AccessChain::alignment) only accounts for the base of
            // the reference type and any scalar component selection in the accesschain,
            // and this function computes the rest from the SPIR-V Offset decorations.
            Instruction *accessChain = module.getInstruction(inst.getIdOperand(0));
            if (accessChain->getOpCode() == OpAccessChain) {
                Instruction *base = module.getInstruction(accessChain->getIdOperand(0));
                // Get the type of the base of the access chain. It must be a pointer type.
                Id typeId = base->getTypeId();
                Instruction *type = module.getInstruction(typeId);
                assert(type->getOpCode() == OpTypePointer);
                if (type->getImmediateOperand(0) != StorageClassPhysicalStorageBufferEXT) {
                    break;
                }
                // Get the pointee type.
                typeId = type->getIdOperand(1);
                type = module.getInstruction(typeId);
                // Walk the index list for the access chain. For each index, find any
                // misalignment that can apply when accessing the member/element via
                // Offset/ArrayStride/MatrixStride decorations, and bitwise OR them all
                // together.
                int alignment = 0;
                for (int i = 1; i < accessChain->getNumOperands(); ++i) {
                    Instruction *idx = module.getInstruction(accessChain->getIdOperand(i));
                    if (type->getOpCode() == OpTypeStruct) {
                        assert(idx->getOpCode() == OpConstant);
                        unsigned int c = idx->getImmediateOperand(0);

                        const auto function = [&](const std::unique_ptr<Instruction>& decoration) {
                            if (decoration.get()->getOpCode() == OpMemberDecorate &&
                                decoration.get()->getIdOperand(0) == typeId &&
                                decoration.get()->getImmediateOperand(1) == c &&
                                (decoration.get()->getImmediateOperand(2) == DecorationOffset ||
                                 decoration.get()->getImmediateOperand(2) == DecorationMatrixStride)) {
                                alignment |= decoration.get()->getImmediateOperand(3);
                            }
                        };
                        std::for_each(decorations.begin(), decorations.end(), function);
                        // get the next member type
                        typeId = type->getIdOperand(c);
                        type = module.getInstruction(typeId);
                    } else if (type->getOpCode() == OpTypeArray ||
                               type->getOpCode() == OpTypeRuntimeArray) {
                        const auto function = [&](const std::unique_ptr<Instruction>& decoration) {
                            if (decoration.get()->getOpCode() == OpDecorate &&
                                decoration.get()->getIdOperand(0) == typeId &&
                                decoration.get()->getImmediateOperand(1) == DecorationArrayStride) {
                                alignment |= decoration.get()->getImmediateOperand(2);
                            }
                        };
                        std::for_each(decorations.begin(), decorations.end(), function);
                        // Get the element type
                        typeId = type->getIdOperand(0);
                        type = module.getInstruction(typeId);
                    } else {
                        // Once we get to any non-aggregate type, we're done.
                        break;
                    }
                }
                assert(inst.getNumOperands() >= 3);
                unsigned int memoryAccess = inst.getImmediateOperand((inst.getOpCode() == OpStore) ? 2 : 1);
                assert(memoryAccess & MemoryAccessAlignedMask);
                static_cast<void>(memoryAccess);
                // Compute the index of the alignment operand.
                int alignmentIdx = 2;
                if (inst.getOpCode() == OpStore)
                    alignmentIdx++;
                // Merge new and old (mis)alignment
                alignment |= inst.getImmediateOperand(alignmentIdx);
                // Pick the LSB
                alignment = alignment & ~(alignment & (alignment-1));
                // update the Aligned operand
                inst.setImmediateOperand(alignmentIdx, alignment);
            }
            break;
        }

    default:
        break;
    }

    // Checks based on type
    if (inst.getTypeId() != NoType)
        postProcessType(inst, inst.getTypeId());
    for (int op = 0; op < inst.getNumOperands(); ++op) {
        if (inst.isIdOperand(op)) {
            // In blocks, these are always result ids, but we are relying on
            // getTypeId() to return NoType for things like OpLabel.
            if (getTypeId(inst.getIdOperand(op)) != NoType)
                postProcessType(inst, getTypeId(inst.getIdOperand(op)));
        }
    }
}